

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Wasm::WasmBytecodeGenerator::PrintOpBegin(WasmBytecodeGenerator *this,WasmOp op)

{
  int iVar1;
  uint uVar2;
  WasmType type;
  uint uVar3;
  WasmBinaryReader *pWVar4;
  char16 *pcVar5;
  WasmBinaryReader *pWVar6;
  WasmFunctionInfo *pWVar7;
  uint32 uVar8;
  ulong uVar9;
  char16_t *pcVar10;
  WasmBlock WVar11;
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c PrintSignature;
  
  if (this->lastOpId == this->opId) {
    Output::Print(L"\r\n");
  }
  iVar1 = (this->m_blockInfos).list.
          super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  uVar8 = this->opId + 1;
  this->opId = uVar8;
  this->lastOpId = uVar8;
  uVar2 = iVar1 - 1;
  if (0 < (int)uVar2) {
    Output::SkipToColumn((ulong)uVar2);
  }
  uVar2 = (uint)op;
  local_20.this = this;
  if ((wbI32SatTruncS_F32|prefixThreads|wbNop) < op) {
    switch(op) {
    case wbV128Load:
      pcVar10 = L"V128Load";
      break;
    default:
      goto switchD_00f2cebf_caseD_fd01;
    case wbV128Store:
      pcVar10 = L"V128Store";
      break;
    case wbV128Const:
      pcVar10 = L"V128Const";
      break;
    case wbV8X16Shuffle:
      pcVar10 = L"V8X16Shuffle";
      break;
    case wbI16Splat:
      pcVar10 = L"I16Splat";
      break;
    case wbI8Splat:
      pcVar10 = L"I8Splat";
      break;
    case wbI4Splat:
      pcVar10 = L"I4Splat";
      break;
    case wbI2Splat:
      pcVar10 = L"I2Splat";
      break;
    case wbF4Splat:
      pcVar10 = L"F4Splat";
      break;
    case wbF2Splat:
      pcVar10 = L"F2Splat";
      break;
    case wbI16ExtractLaneS:
      pcVar10 = L"I16ExtractLaneS";
      break;
    case wbI16ExtractLaneU:
      pcVar10 = L"I16ExtractLaneU";
      break;
    case wbI16ReplaceLane:
      pcVar10 = L"I16ReplaceLane";
      break;
    case wbI8ExtractLaneS:
      pcVar10 = L"I8ExtractLaneS";
      break;
    case wbI8ExtractLaneU:
      pcVar10 = L"I8ExtractLaneU";
      break;
    case wbI8ReplaceLane:
      pcVar10 = L"I8ReplaceLane";
      break;
    case wbI4ExtractLane:
      pcVar10 = L"I4ExtractLane";
      break;
    case wbI4ReplaceLane:
      pcVar10 = L"I4ReplaceLane";
      break;
    case wbI2ExtractLane:
      pcVar10 = L"I2ExtractLane";
      break;
    case wbI2ReplaceLane:
      pcVar10 = L"I2ReplaceLane";
      break;
    case wbF4ExtractLane:
      pcVar10 = L"F4ExtractLane";
      break;
    case wbF4ReplaceLane:
      pcVar10 = L"F4ReplaceLane";
      break;
    case wbF2ExtractLane:
      pcVar10 = L"F2ExtractLane";
      break;
    case wbF2ReplaceLane:
      pcVar10 = L"F2ReplaceLane";
      break;
    case wbI16Eq:
      pcVar10 = L"I16Eq";
      break;
    case wbI16Ne:
      pcVar10 = L"I16Ne";
      break;
    case wbI16LtS:
      pcVar10 = L"I16LtS";
      break;
    case wbI16LtU:
      pcVar10 = L"I16LtU";
      break;
    case wbI16GtS:
      pcVar10 = L"I16GtS";
      break;
    case wbI16GtU:
      pcVar10 = L"I16GtU";
      break;
    case wbI16LeS:
      pcVar10 = L"I16LeS";
      break;
    case wbI16LeU:
      pcVar10 = L"I16LeU";
      break;
    case wbI16GeS:
      pcVar10 = L"I16GeS";
      break;
    case wbI16GeU:
      pcVar10 = L"I16GeU";
      break;
    case wbI8Eq:
      pcVar10 = L"I8Eq";
      break;
    case wbI8Ne:
      pcVar10 = L"I8Ne";
      break;
    case wbI8LtS:
      pcVar10 = L"I8LtS";
      break;
    case wbI8LtU:
      pcVar10 = L"I8LtU";
      break;
    case wbI8GtS:
      pcVar10 = L"I8GtS";
      break;
    case wbI8GtU:
      pcVar10 = L"I8GtU";
      break;
    case wbI8LeS:
      pcVar10 = L"I8LeS";
      break;
    case wbI8LeU:
      pcVar10 = L"I8LeU";
      break;
    case wbI8GeS:
      pcVar10 = L"I8GeS";
      break;
    case wbI8GeU:
      pcVar10 = L"I8GeU";
      break;
    case wbI4Eq:
      pcVar10 = L"I4Eq";
      break;
    case wbI4Ne:
      pcVar10 = L"I4Ne";
      break;
    case wbI4LtS:
      pcVar10 = L"I4LtS";
      break;
    case wbI4LtU:
      pcVar10 = L"I4LtU";
      break;
    case wbI4GtS:
      pcVar10 = L"I4GtS";
      break;
    case wbI4GtU:
      pcVar10 = L"I4GtU";
      break;
    case wbI4LeS:
      pcVar10 = L"I4LeS";
      break;
    case wbI4LeU:
      pcVar10 = L"I4LeU";
      break;
    case wbI4GeS:
      pcVar10 = L"I4GeS";
      break;
    case wbI4GeU:
      pcVar10 = L"I4GeU";
      break;
    case wbF4Eq:
      pcVar10 = L"F4Eq";
      break;
    case wbF4Ne:
      pcVar10 = L"F4Ne";
      break;
    case wbF4Lt:
      pcVar10 = L"F4Lt";
      break;
    case wbF4Gt:
      pcVar10 = L"F4Gt";
      break;
    case wbF4Le:
      pcVar10 = L"F4Le";
      break;
    case wbF4Ge:
      pcVar10 = L"F4Ge";
      break;
    case wbF2Eq:
      pcVar10 = L"F2Eq";
      break;
    case wbF2Ne:
      pcVar10 = L"F2Ne";
      break;
    case wbF2Lt:
      pcVar10 = L"F2Lt";
      break;
    case wbF2Gt:
      pcVar10 = L"F2Gt";
      break;
    case wbF2Le:
      pcVar10 = L"F2Le";
      break;
    case wbF2Ge:
      pcVar10 = L"F2Ge";
      break;
    case wbV128Not:
      pcVar10 = L"V128Not";
      break;
    case wbV128And:
      pcVar10 = L"V128And";
      break;
    case wbV128Or:
      pcVar10 = L"V128Or";
      break;
    case wbV128Xor:
      pcVar10 = L"V128Xor";
      break;
    case wbV128Bitselect:
      pcVar10 = L"V128Bitselect";
      break;
    case wbI16Neg:
      pcVar10 = L"I16Neg";
      break;
    case wbI16AnyTrue:
      pcVar10 = L"I16AnyTrue";
      break;
    case wbI16AllTrue:
      pcVar10 = L"I16AllTrue";
      break;
    case wbI16Shl:
      pcVar10 = L"I16Shl";
      break;
    case wbI16ShrS:
      pcVar10 = L"I16ShrS";
      break;
    case wbI16ShrU:
      pcVar10 = L"I16ShrU";
      break;
    case wbI16Add:
      pcVar10 = L"I16Add";
      break;
    case wbI16AddSaturateS:
      pcVar10 = L"I16AddSaturateS";
      break;
    case wbI16AddSaturateU:
      pcVar10 = L"I16AddSaturateU";
      break;
    case wbI16Sub:
      pcVar10 = L"I16Sub";
      break;
    case wbI16SubSaturateS:
      pcVar10 = L"I16SubSaturateS";
      break;
    case wbI16SubSaturateU:
      pcVar10 = L"I16SubSaturateU";
      break;
    case wbI8Neg:
      pcVar10 = L"I8Neg";
      break;
    case wbI8AnyTrue:
      pcVar10 = L"I8AnyTrue";
      break;
    case wbI8AllTrue:
      pcVar10 = L"I8AllTrue";
      break;
    case wbI8Shl:
      pcVar10 = L"I8Shl";
      break;
    case wbI8ShrS:
      pcVar10 = L"I8ShrS";
      break;
    case wbI8ShrU:
      pcVar10 = L"I8ShrU";
      break;
    case wbI8Add:
      pcVar10 = L"I8Add";
      break;
    case wbI8AddSaturateS:
      pcVar10 = L"I8AddSaturateS";
      break;
    case wbI8AddSaturateU:
      pcVar10 = L"I8AddSaturateU";
      break;
    case wbI8Sub:
      pcVar10 = L"I8Sub";
      break;
    case wbI8SubSaturateS:
      pcVar10 = L"I8SubSaturateS";
      break;
    case wbI8SubSaturateU:
      pcVar10 = L"I8SubSaturateU";
      break;
    case wbI8Mul:
      pcVar10 = L"I8Mul";
      break;
    case wbI4Neg:
      pcVar10 = L"I4Neg";
      break;
    case wbI4AnyTrue:
      pcVar10 = L"I4AnyTrue";
      break;
    case wbI4AllTrue:
      pcVar10 = L"I4AllTrue";
      break;
    case wbI4Shl:
      pcVar10 = L"I4Shl";
      break;
    case wbI4ShrS:
      pcVar10 = L"I4ShrS";
      break;
    case wbI4ShrU:
      pcVar10 = L"I4ShrU";
      break;
    case wbI4Add:
      pcVar10 = L"I4Add";
      break;
    case wbI4Sub:
      pcVar10 = L"I4Sub";
      break;
    case wbI4Mul:
      pcVar10 = L"I4Mul";
      break;
    case wbI2Neg:
      pcVar10 = L"I2Neg";
      break;
    case wbI2Shl:
      pcVar10 = L"I2Shl";
      break;
    case wbI2ShrS:
      pcVar10 = L"I2ShrS";
      break;
    case wbI2ShrU:
      pcVar10 = L"I2ShrU";
      break;
    case wbI2Add:
      pcVar10 = L"I2Add";
      break;
    case wbI2Sub:
      pcVar10 = L"I2Sub";
      break;
    case wbF4Abs:
      pcVar10 = L"F4Abs";
      break;
    case wbF4Neg:
      pcVar10 = L"F4Neg";
      break;
    case wbF4Sqrt:
      pcVar10 = L"F4Sqrt";
      break;
    case wbF4Add:
      pcVar10 = L"F4Add";
      break;
    case wbF4Sub:
      pcVar10 = L"F4Sub";
      break;
    case wbF4Mul:
      pcVar10 = L"F4Mul";
      break;
    case wbF4Div:
      pcVar10 = L"F4Div";
      break;
    case wbF4Min:
      pcVar10 = L"F4Min";
      break;
    case wbF4Max:
      pcVar10 = L"F4Max";
      break;
    case wbF2Abs:
      pcVar10 = L"F2Abs";
      break;
    case wbF2Neg:
      pcVar10 = L"F2Neg";
      break;
    case wbF2Sqrt:
      pcVar10 = L"F2Sqrt";
      break;
    case wbF2Add:
      pcVar10 = L"F2Add";
      break;
    case wbF2Sub:
      pcVar10 = L"F2Sub";
      break;
    case wbF2Mul:
      pcVar10 = L"F2Mul";
      break;
    case wbF2Div:
      pcVar10 = L"F2Div";
      break;
    case wbF2Min:
      pcVar10 = L"F2Min";
      break;
    case wbF2Max:
      pcVar10 = L"F2Max";
      break;
    case wbI4TruncS:
      pcVar10 = L"I4TruncS";
      break;
    case wbI4TruncU:
      pcVar10 = L"I4TruncU";
      break;
    case wbF4ConvertS:
      pcVar10 = L"F4ConvertS";
      break;
    case wbF4ConvertU:
      pcVar10 = L"F4ConvertU";
      break;
    case wbI32AtomicLoad:
      pcVar10 = L"I32AtomicLoad";
      break;
    case wbI64AtomicLoad:
      pcVar10 = L"I64AtomicLoad";
      break;
    case wbI32AtomicLoad8U:
      pcVar10 = L"I32AtomicLoad8U";
      break;
    case wbI32AtomicLoad16U:
      pcVar10 = L"I32AtomicLoad16U";
      break;
    case wbI64AtomicLoad8U:
      pcVar10 = L"I64AtomicLoad8U";
      break;
    case wbI64AtomicLoad16U:
      pcVar10 = L"I64AtomicLoad16U";
      break;
    case wbI64AtomicLoad32U:
      pcVar10 = L"I64AtomicLoad32U";
      break;
    case wbI32AtomicStore:
      pcVar10 = L"I32AtomicStore";
      break;
    case wbI64AtomicStore:
      pcVar10 = L"I64AtomicStore";
      break;
    case wbI32AtomicStore8:
      pcVar10 = L"I32AtomicStore8";
      break;
    case wbI32AtomicStore16:
      pcVar10 = L"I32AtomicStore16";
      break;
    case wbI64AtomicStore8:
      pcVar10 = L"I64AtomicStore8";
      break;
    case wbI64AtomicStore16:
      pcVar10 = L"I64AtomicStore16";
      break;
    case wbI64AtomicStore32:
      pcVar10 = L"I64AtomicStore32";
      break;
    case wbI32AtomicRmwAdd:
      pcVar10 = L"I32AtomicRmwAdd";
      break;
    case wbI64AtomicRmwAdd:
      pcVar10 = L"I64AtomicRmwAdd";
      break;
    case wbI32AtomicRmw8UAdd:
      pcVar10 = L"I32AtomicRmw8UAdd";
      break;
    case wbI32AtomicRmw16UAdd:
      pcVar10 = L"I32AtomicRmw16UAdd";
      break;
    case wbI64AtomicRmw8UAdd:
      pcVar10 = L"I64AtomicRmw8UAdd";
      break;
    case wbI64AtomicRmw16UAdd:
      pcVar10 = L"I64AtomicRmw16UAdd";
      break;
    case wbI64AtomicRmw32UAdd:
      pcVar10 = L"I64AtomicRmw32UAdd";
      break;
    case wbI32AtomicRmwSub:
      pcVar10 = L"I32AtomicRmwSub";
      break;
    case wbI64AtomicRmwSub:
      pcVar10 = L"I64AtomicRmwSub";
      break;
    case wbI32AtomicRmw8USub:
      pcVar10 = L"I32AtomicRmw8USub";
      break;
    case wbI32AtomicRmw16USub:
      pcVar10 = L"I32AtomicRmw16USub";
      break;
    case wbI64AtomicRmw8USub:
      pcVar10 = L"I64AtomicRmw8USub";
      break;
    case wbI64AtomicRmw16USub:
      pcVar10 = L"I64AtomicRmw16USub";
      break;
    case wbI64AtomicRmw32USub:
      pcVar10 = L"I64AtomicRmw32USub";
      break;
    case wbI32AtomicRmwAnd:
      pcVar10 = L"I32AtomicRmwAnd";
      break;
    case wbI64AtomicRmwAnd:
      pcVar10 = L"I64AtomicRmwAnd";
      break;
    case wbI32AtomicRmw8UAnd:
      pcVar10 = L"I32AtomicRmw8UAnd";
      break;
    case wbI32AtomicRmw16UAnd:
      pcVar10 = L"I32AtomicRmw16UAnd";
      break;
    case wbI64AtomicRmw8UAnd:
      pcVar10 = L"I64AtomicRmw8UAnd";
      break;
    case wbI64AtomicRmw16UAnd:
      pcVar10 = L"I64AtomicRmw16UAnd";
      break;
    case wbI64AtomicRmw32UAnd:
      pcVar10 = L"I64AtomicRmw32UAnd";
      break;
    case wbI32AtomicRmwOr:
      pcVar10 = L"I32AtomicRmwOr";
      break;
    case wbI64AtomicRmwOr:
      pcVar10 = L"I64AtomicRmwOr";
      break;
    case wbI32AtomicRmw8UOr:
      pcVar10 = L"I32AtomicRmw8UOr";
      break;
    case wbI32AtomicRmw16UOr:
      pcVar10 = L"I32AtomicRmw16UOr";
      break;
    case wbI64AtomicRmw8UOr:
      pcVar10 = L"I64AtomicRmw8UOr";
      break;
    case wbI64AtomicRmw16UOr:
      pcVar10 = L"I64AtomicRmw16UOr";
      break;
    case wbI64AtomicRmw32UOr:
      pcVar10 = L"I64AtomicRmw32UOr";
      break;
    case wbI32AtomicRmwXor:
      pcVar10 = L"I32AtomicRmwXor";
      break;
    case wbI64AtomicRmwXor:
      pcVar10 = L"I64AtomicRmwXor";
      break;
    case wbI32AtomicRmw8UXor:
      pcVar10 = L"I32AtomicRmw8UXor";
      break;
    case wbI32AtomicRmw16UXor:
      pcVar10 = L"I32AtomicRmw16UXor";
      break;
    case wbI64AtomicRmw8UXor:
      pcVar10 = L"I64AtomicRmw8UXor";
      break;
    case wbI64AtomicRmw16UXor:
      pcVar10 = L"I64AtomicRmw16UXor";
      break;
    case wbI64AtomicRmw32UXor:
      pcVar10 = L"I64AtomicRmw32UXor";
      break;
    case wbI32AtomicRmwXchg:
      pcVar10 = L"I32AtomicRmwXchg";
      break;
    case wbI64AtomicRmwXchg:
      pcVar10 = L"I64AtomicRmwXchg";
      break;
    case wbI32AtomicRmw8UXchg:
      pcVar10 = L"I32AtomicRmw8UXchg";
      break;
    case wbI32AtomicRmw16UXchg:
      pcVar10 = L"I32AtomicRmw16UXchg";
      break;
    case wbI64AtomicRmw8UXchg:
      pcVar10 = L"I64AtomicRmw8UXchg";
      break;
    case wbI64AtomicRmw16UXchg:
      pcVar10 = L"I64AtomicRmw16UXchg";
      break;
    case wbI64AtomicRmw32UXchg:
      pcVar10 = L"I64AtomicRmw32UXchg";
      break;
    case wbI32AtomicRmwCmpxchg:
      pcVar10 = L"I32AtomicRmwCmpxchg";
      break;
    case wbI64AtomicRmwCmpxchg:
      pcVar10 = L"I64AtomicRmwCmpxchg";
      break;
    case wbI32AtomicRmw8UCmpxchg:
      pcVar10 = L"I32AtomicRmw8UCmpxchg";
      break;
    case wbI32AtomicRmw16UCmpxchg:
      pcVar10 = L"I32AtomicRmw16UCmpxchg";
      break;
    case wbI64AtomicRmw8UCmpxchg:
      pcVar10 = L"I64AtomicRmw8UCmpxchg";
      break;
    case wbI64AtomicRmw16UCmpxchg:
      pcVar10 = L"I64AtomicRmw16UCmpxchg";
      break;
    case wbI64AtomicRmw32UCmpxchg:
      pcVar10 = L"I64AtomicRmw32UCmpxchg";
    }
    goto LAB_00f2e132;
  }
  switch(op) {
  case wbUnreachable:
    pcVar10 = L"Unreachable";
    break;
  case wbNop:
    pcVar10 = L"Nop";
    break;
  case wbBlock:
    pcVar10 = L"Block";
    break;
  case wbLoop:
    pcVar10 = L"Loop";
    break;
  case wbIf:
    pcVar10 = L"If";
    break;
  case wbElse:
    pcVar10 = L"Else";
    break;
  case wbIf|wbBlock:
  case wbIf|wbLoop:
  case 8:
  case 9:
  case 10:
  case wbCall|wbBlock:
  case wbCall|wbLoop:
  case wbCall|wbIf:
  case wbCall|wbElse:
  case wbCall|wbIf|wbBlock:
  case wbCall|wbIf|wbLoop:
  case 0x18:
  case 0x19:
  case wbCall|wbBr:
  case wbCall|wbBrIf:
  case wbCall|wbBrTable:
  case wbCall|wbReturn:
  case wbSetGlobal|wbNop:
  case wbSetGlobal|wbBlock:
  case wbSetGlobal|wbLoop:
    goto switchD_00f2cebf_caseD_fd01;
  case wbEnd:
    pcVar10 = L"End";
    break;
  case wbBr:
    pcVar10 = L"Br";
    break;
  case wbBrIf:
    pcVar10 = L"BrIf";
    break;
  case wbBrTable:
    pcVar10 = L"BrTable";
    break;
  case wbReturn:
    pcVar10 = L"Return";
    break;
  case wbCall:
    pcVar10 = L"Call";
    break;
  case wbCallIndirect:
    pcVar10 = L"CallIndirect";
    break;
  case wbDrop:
    pcVar10 = L"Drop";
    break;
  case wbSelect:
    pcVar10 = L"Select";
    break;
  case wbGetLocal:
    pcVar10 = L"GetLocal";
    break;
  case wbSetLocal:
    pcVar10 = L"SetLocal";
    break;
  case wbTeeLocal:
    pcVar10 = L"TeeLocal";
    break;
  case wbGetGlobal:
    pcVar10 = L"GetGlobal";
    break;
  case wbSetGlobal:
    pcVar10 = L"SetGlobal";
    break;
  case wbI32LoadMem:
    pcVar10 = L"I32LoadMem";
    break;
  case wbI64LoadMem:
    pcVar10 = L"I64LoadMem";
    break;
  case wbF32LoadMem:
    pcVar10 = L"F32LoadMem";
    break;
  case wbF64LoadMem:
    pcVar10 = L"F64LoadMem";
    break;
  case wbI32LoadMem8S:
    pcVar10 = L"I32LoadMem8S";
    break;
  case wbI32LoadMem8U:
    pcVar10 = L"I32LoadMem8U";
    break;
  case wbI32LoadMem16S:
    pcVar10 = L"I32LoadMem16S";
    break;
  case wbI32LoadMem16U:
    pcVar10 = L"I32LoadMem16U";
    break;
  case wbI64LoadMem8S:
    pcVar10 = L"I64LoadMem8S";
    break;
  case wbI64LoadMem8U:
    pcVar10 = L"I64LoadMem8U";
    break;
  case wbI64LoadMem16S:
    pcVar10 = L"I64LoadMem16S";
    break;
  case wbI64LoadMem16U:
    pcVar10 = L"I64LoadMem16U";
    break;
  case wbI64LoadMem32S:
    pcVar10 = L"I64LoadMem32S";
    break;
  case wbI64LoadMem32U:
    pcVar10 = L"I64LoadMem32U";
    break;
  case wbI32StoreMem:
    pcVar10 = L"I32StoreMem";
    break;
  case wbI64StoreMem:
    pcVar10 = L"I64StoreMem";
    break;
  case wbF32StoreMem:
    pcVar10 = L"F32StoreMem";
    break;
  case wbF64StoreMem:
    pcVar10 = L"F64StoreMem";
    break;
  case wbI32StoreMem8:
    pcVar10 = L"I32StoreMem8";
    break;
  case wbI32StoreMem16:
    pcVar10 = L"I32StoreMem16";
    break;
  case wbI64StoreMem8:
    pcVar10 = L"I64StoreMem8";
    break;
  case wbI64StoreMem16:
    pcVar10 = L"I64StoreMem16";
    break;
  case wbI64StoreMem32:
    pcVar10 = L"I64StoreMem32";
    break;
  case wbMemorySize:
    pcVar10 = L"MemorySize";
    break;
  case wbMemoryGrow:
    pcVar10 = L"MemoryGrow";
    break;
  case wbI32Const:
    pcVar10 = L"I32Const";
    break;
  case wbI64Const:
    pcVar10 = L"I64Const";
    break;
  case wbF32Const:
    pcVar10 = L"F32Const";
    break;
  case wbF64Const:
    pcVar10 = L"F64Const";
    break;
  case wbI32Eqz:
    pcVar10 = L"I32Eqz";
    break;
  case wbI32Eq:
    pcVar10 = L"I32Eq";
    break;
  case wbI32Ne:
    pcVar10 = L"I32Ne";
    break;
  case wbI32LtS:
    pcVar10 = L"I32LtS";
    break;
  case wbI32LtU:
    pcVar10 = L"I32LtU";
    break;
  case wbI32GtS:
    pcVar10 = L"I32GtS";
    break;
  case wbI32GtU:
    pcVar10 = L"I32GtU";
    break;
  case wbI32LeS:
    pcVar10 = L"I32LeS";
    break;
  case wbI32LeU:
    pcVar10 = L"I32LeU";
    break;
  case wbI32GeS:
    pcVar10 = L"I32GeS";
    break;
  case wbI32GeU:
    pcVar10 = L"I32GeU";
    break;
  case wbI64Eqz:
    pcVar10 = L"I64Eqz";
    break;
  case wbI64Eq:
    pcVar10 = L"I64Eq";
    break;
  case wbI64Ne:
    pcVar10 = L"I64Ne";
    break;
  case wbI64LtS:
    pcVar10 = L"I64LtS";
    break;
  case wbI64LtU:
    pcVar10 = L"I64LtU";
    break;
  case wbI64GtS:
    pcVar10 = L"I64GtS";
    break;
  case wbI64GtU:
    pcVar10 = L"I64GtU";
    break;
  case wbI64LeS:
    pcVar10 = L"I64LeS";
    break;
  case wbI64LeU:
    pcVar10 = L"I64LeU";
    break;
  case wbI64GeS:
    pcVar10 = L"I64GeS";
    break;
  case wbI64GeU:
    pcVar10 = L"I64GeU";
    break;
  case wbF32Eq:
    pcVar10 = L"F32Eq";
    break;
  case wbF32Ne:
    pcVar10 = L"F32Ne";
    break;
  case wbF32Lt:
    pcVar10 = L"F32Lt";
    break;
  case wbF32Gt:
    pcVar10 = L"F32Gt";
    break;
  case wbF32Le:
    pcVar10 = L"F32Le";
    break;
  case wbF32Ge:
    pcVar10 = L"F32Ge";
    break;
  case wbF64Eq:
    pcVar10 = L"F64Eq";
    break;
  case wbF64Ne:
    pcVar10 = L"F64Ne";
    break;
  case wbF64Lt:
    pcVar10 = L"F64Lt";
    break;
  case wbF64Gt:
    pcVar10 = L"F64Gt";
    break;
  case wbF64Le:
    pcVar10 = L"F64Le";
    break;
  case wbF64Ge:
    pcVar10 = L"F64Ge";
    break;
  case wbI32Clz:
    pcVar10 = L"I32Clz";
    break;
  case wbI32Ctz:
    pcVar10 = L"I32Ctz";
    break;
  case wbI32Popcnt:
    pcVar10 = L"I32Popcnt";
    break;
  case wbI32Add:
    pcVar10 = L"I32Add";
    break;
  case wbI32Sub:
    pcVar10 = L"I32Sub";
    break;
  case wbI32Mul:
    pcVar10 = L"I32Mul";
    break;
  case wbI32DivS:
    pcVar10 = L"I32DivS";
    break;
  case wbI32DivU:
    pcVar10 = L"I32DivU";
    break;
  case wbI32RemS:
    pcVar10 = L"I32RemS";
    break;
  case wbI32RemU:
    pcVar10 = L"I32RemU";
    break;
  case wbI32And:
    pcVar10 = L"I32And";
    break;
  case wbI32Or:
    pcVar10 = L"I32Or";
    break;
  case wbI32Xor:
    pcVar10 = L"I32Xor";
    break;
  case wbI32Shl:
    pcVar10 = L"I32Shl";
    break;
  case wbI32ShrS:
    pcVar10 = L"I32ShrS";
    break;
  case wbI32ShrU:
    pcVar10 = L"I32ShrU";
    break;
  case wbI32Rol:
    pcVar10 = L"I32Rol";
    break;
  case wbI32Ror:
    pcVar10 = L"I32Ror";
    break;
  case wbI64Clz:
    pcVar10 = L"I64Clz";
    break;
  case wbI64Ctz:
    pcVar10 = L"I64Ctz";
    break;
  case wbI64Popcnt:
    pcVar10 = L"I64Popcnt";
    break;
  case wbI64Add:
    pcVar10 = L"I64Add";
    break;
  case wbI64Sub:
    pcVar10 = L"I64Sub";
    break;
  case wbI64Mul:
    pcVar10 = L"I64Mul";
    break;
  case wbI64DivS:
    pcVar10 = L"I64DivS";
    break;
  case wbI64DivU:
    pcVar10 = L"I64DivU";
    break;
  case wbI64RemS:
    pcVar10 = L"I64RemS";
    break;
  case wbI64RemU:
    pcVar10 = L"I64RemU";
    break;
  case wbI64And:
    pcVar10 = L"I64And";
    break;
  case wbI64Or:
    pcVar10 = L"I64Or";
    break;
  case wbI64Xor:
    pcVar10 = L"I64Xor";
    break;
  case wbI64Shl:
    pcVar10 = L"I64Shl";
    break;
  case wbI64ShrS:
    pcVar10 = L"I64ShrS";
    break;
  case wbI64ShrU:
    pcVar10 = L"I64ShrU";
    break;
  case wbI64Rol:
    pcVar10 = L"I64Rol";
    break;
  case wbI64Ror:
    pcVar10 = L"I64Ror";
    break;
  case wbF32Abs:
    pcVar10 = L"F32Abs";
    break;
  case wbF32Neg:
    pcVar10 = L"F32Neg";
    break;
  case wbF32Ceil:
    pcVar10 = L"F32Ceil";
    break;
  case wbF32Floor:
    pcVar10 = L"F32Floor";
    break;
  case wbF32Trunc:
    pcVar10 = L"F32Trunc";
    break;
  case wbF32NearestInt:
    pcVar10 = L"F32NearestInt";
    break;
  case wbF32Sqrt:
    pcVar10 = L"F32Sqrt";
    break;
  case wbF32Add:
    pcVar10 = L"F32Add";
    break;
  case wbF32Sub:
    pcVar10 = L"F32Sub";
    break;
  case wbF32Mul:
    pcVar10 = L"F32Mul";
    break;
  case wbF32Div:
    pcVar10 = L"F32Div";
    break;
  case wbF32Min:
    pcVar10 = L"F32Min";
    break;
  case wbF32Max:
    pcVar10 = L"F32Max";
    break;
  case wbF32CopySign:
    pcVar10 = L"F32CopySign";
    break;
  case wbF64Abs:
    pcVar10 = L"F64Abs";
    break;
  case wbF64Neg:
    pcVar10 = L"F64Neg";
    break;
  case wbF64Ceil:
    pcVar10 = L"F64Ceil";
    break;
  case wbF64Floor:
    pcVar10 = L"F64Floor";
    break;
  case wbF64Trunc:
    pcVar10 = L"F64Trunc";
    break;
  case wbF64NearestInt:
    pcVar10 = L"F64NearestInt";
    break;
  case wbF64Sqrt:
    pcVar10 = L"F64Sqrt";
    break;
  case wbF64Add:
    pcVar10 = L"F64Add";
    break;
  case wbF64Sub:
    pcVar10 = L"F64Sub";
    break;
  case wbF64Mul:
    pcVar10 = L"F64Mul";
    break;
  case wbF64Div:
    pcVar10 = L"F64Div";
    break;
  case wbF64Min:
    pcVar10 = L"F64Min";
    break;
  case wbF64Max:
    pcVar10 = L"F64Max";
    break;
  case wbF64CopySign:
    pcVar10 = L"F64CopySign";
    break;
  case wbI32Wrap_I64:
    pcVar10 = L"I32Wrap_I64";
    break;
  case wbI32TruncS_F32:
    pcVar10 = L"I32TruncS_F32";
    break;
  case wbI32TruncU_F32:
    pcVar10 = L"I32TruncU_F32";
    break;
  case wbI32TruncS_F64:
    pcVar10 = L"I32TruncS_F64";
    break;
  case wbI32TruncU_F64:
    pcVar10 = L"I32TruncU_F64";
    break;
  case wbI64ExtendS_I32:
    pcVar10 = L"I64ExtendS_I32";
    break;
  case wbI64ExtendU_I32:
    pcVar10 = L"I64ExtendU_I32";
    break;
  case wbI64TruncS_F32:
    pcVar10 = L"I64TruncS_F32";
    break;
  case wbI64TruncU_F32:
    pcVar10 = L"I64TruncU_F32";
    break;
  case wbI64TruncS_F64:
    pcVar10 = L"I64TruncS_F64";
    break;
  case wbI64TruncU_F64:
    pcVar10 = L"I64TruncU_F64";
    break;
  case wbF32SConvertI32:
    pcVar10 = L"F32SConvertI32";
    break;
  case wbF32UConvertI32:
    pcVar10 = L"F32UConvertI32";
    break;
  case wbF32SConvertI64:
    pcVar10 = L"F32SConvertI64";
    break;
  case wbF32UConvertI64:
    pcVar10 = L"F32UConvertI64";
    break;
  case wbF32DemoteF64:
    pcVar10 = L"F32DemoteF64";
    break;
  case wbF64SConvertI32:
    pcVar10 = L"F64SConvertI32";
    break;
  case wbF64UConvertI32:
    pcVar10 = L"F64UConvertI32";
    break;
  case wbF64SConvertI64:
    pcVar10 = L"F64SConvertI64";
    break;
  case wbF64UConvertI64:
    pcVar10 = L"F64UConvertI64";
    break;
  case wbF64PromoteF32:
    pcVar10 = L"F64PromoteF32";
    break;
  case wbI32ReinterpretF32:
    pcVar10 = L"I32ReinterpretF32";
    break;
  case wbI64ReinterpretF64:
    pcVar10 = L"I64ReinterpretF64";
    break;
  case wbF32ReinterpretI32:
    pcVar10 = L"F32ReinterpretI32";
    break;
  case wbF64ReinterpretI64:
    pcVar10 = L"F64ReinterpretI64";
    break;
  case wbI32Extend8_s:
    pcVar10 = L"I32Extend8_s";
    break;
  case wbI32Extend16_s:
    pcVar10 = L"I32Extend16_s";
    break;
  case wbI64Extend8_s:
    pcVar10 = L"I64Extend8_s";
    break;
  case wbI64Extend16_s:
    pcVar10 = L"I64Extend16_s";
    break;
  case wbI64Extend32_s:
    pcVar10 = L"I64Extend32_s";
    break;
  default:
    switch(uVar2) {
    case 0xf000:
      pcVar10 = L"PrintFuncName";
      break;
    case 0xf001:
      pcVar10 = L"PrintArgSeparator";
      break;
    case 0xf002:
      pcVar10 = L"PrintBeginCall";
      break;
    case 0xf003:
      pcVar10 = L"PrintNewLine";
      break;
    case 0xf004:
      pcVar10 = L"PrintEndCall";
      break;
    case 0xf005:
    case 0xf006:
    case 0xf007:
    case 0xf008:
    case 0xf009:
    case 0xf00a:
    case 0xf00b:
      goto switchD_00f2cebf_caseD_fd01;
    case 0xf00c:
      pcVar10 = L"PrintI32";
      break;
    case 0xf00d:
      pcVar10 = L"PrintI64";
      break;
    case 0xf00e:
      pcVar10 = L"PrintF32";
      break;
    case 0xf00f:
      pcVar10 = L"PrintF64";
      break;
    default:
      switch(uVar2) {
      case 0xfc00:
        pcVar10 = L"I32SatTruncS_F32";
        break;
      case 0xfc01:
        pcVar10 = L"I32SatTruncU_F32";
        break;
      case 0xfc02:
        pcVar10 = L"I32SatTruncS_F64";
        break;
      case 0xfc03:
        pcVar10 = L"I32SatTruncU_F64";
        break;
      case 0xfc04:
        pcVar10 = L"I64SatTruncS_F32";
        break;
      case 0xfc05:
        pcVar10 = L"I64SatTruncU_F32";
        break;
      case 0xfc06:
        pcVar10 = L"I64SatTruncS_F64";
        break;
      case 0xfc07:
        pcVar10 = L"I64SatTruncU_F64";
        break;
      default:
        goto switchD_00f2cebf_caseD_fd01;
      }
    }
  }
LAB_00f2e132:
  Output::Print(pcVar10);
switchD_00f2cebf_caseD_fd01:
  if (0xfe0f < op) {
    if (uVar2 - 0xfe10 < 0x3f) goto switchD_00f2e16f_caseD_28;
    goto switchD_00f2e16f_caseD_5;
  }
  switch(uVar2) {
  case 2:
  case 3:
  case 4:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    pWVar4 = pWVar6;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar4 = (this->m_module->m_reader).ptr;
    }
    if ((pWVar4->super_WasmReaderBase).m_currentNode.field_1.block.isSingleResult == true) {
      if (pWVar6 == (WasmBinaryReader *)0x0) {
        pWVar6 = (this->m_module->m_reader).ptr;
      }
      type = WasmBlock::GetSingleResult(&(pWVar6->super_WasmReaderBase).m_currentNode.field_1.block)
      ;
      pcVar5 = WasmTypes::GetTypeName(type);
      Output::Print(L" () -> %s",pcVar5);
      break;
    }
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar8 = WasmBlock::GetSignatureId(&(pWVar6->super_WasmReaderBase).m_currentNode.field_1.block);
    goto LAB_00f2e401;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x3f:
  case 0x40:
    break;
  case 0xc:
  case 0xd:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar9 = (ulong)(pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    pcVar10 = L" depth: %u";
    goto LAB_00f2e1ee;
  case 0xe:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    pWVar4 = pWVar6;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar4 = (this->m_module->m_reader).ptr;
    }
    uVar2 = (pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar3 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
    pcVar10 = L" %u cases, default: %u";
    goto LAB_00f2e21d;
  case 0x10:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar2 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    uVar8 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
    if (uVar2 < uVar8) {
      pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar6 == (WasmBinaryReader *)0x0) {
        pWVar6 = (this->m_module->m_reader).ptr;
      }
      uVar3 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.call.funcType + Function;
      if (uVar3 < 4) {
        pcVar10 = (char16_t *)(&DAT_011dc6fc + *(int *)(&DAT_011dc6fc + (ulong)uVar3 * 4));
      }
      else {
        pcVar10 = L" (unknown)";
      }
      Output::Print(pcVar10);
      pWVar7 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar2);
      Js::FunctionBody::DumpFullFunctionName((pWVar7->m_body).ptr);
      break;
    }
    pcVar10 = L" invalid id %u";
    uVar9 = (ulong)uVar2;
    goto LAB_00f2e1ee;
  case 0x11:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar8 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
LAB_00f2e401:
    PrintOpBegin::anon_class_8_1_8991fb9c::operator()(&local_20,uVar8);
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar9 = (ulong)(pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    pcVar10 = L" (%d)";
LAB_00f2e1ee:
    Output::Print(pcVar10,uVar9);
    break;
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
switchD_00f2e16f_caseD_28:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    pWVar4 = pWVar6;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar4 = (this->m_module->m_reader).ptr;
    }
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    (*(code *)(&DAT_011dbb3c +
              *(int *)(&DAT_011dbb3c +
                      (ulong)((uint)((pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.
                                     numTargets != 0) +
                             (uint)((pWVar4->super_WasmReaderBase).m_currentNode.field_1.mem.
                                    alignment != '\0') * 2) * 4)))();
    return;
  case 0x41:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    pWVar4 = pWVar6;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar4 = (this->m_module->m_reader).ptr;
    }
    uVar2 = (pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    uVar3 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    pcVar10 = L" (%d, 0x%x)";
LAB_00f2e21d:
    Output::Print(pcVar10,(ulong)uVar2,(ulong)uVar3);
    break;
  case 0x42:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    pWVar4 = pWVar6;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar4 = (this->m_module->m_reader).ptr;
    }
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    Output::Print(L" (%lld, 0x%llx)",(pWVar4->super_WasmReaderBase).m_currentNode.field_1.block,
                  (pWVar6->super_WasmReaderBase).m_currentNode.field_1.block);
    break;
  case 0x43:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    WVar11 = (WasmBlock)(double)*(float *)&(pWVar6->super_WasmReaderBase).m_currentNode.field_1;
    goto LAB_00f2e42e;
  case 0x44:
    pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar6 == (WasmBinaryReader *)0x0) {
      pWVar6 = (this->m_module->m_reader).ptr;
    }
    WVar11 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.block;
LAB_00f2e42e:
    Output::Print(L" (%.4f)",WVar11);
    break;
  default:
    if ((uVar2 == 0xfd00) || (uVar2 == 0xfd0b)) goto switchD_00f2e16f_caseD_28;
  }
switchD_00f2e16f_caseD_5:
  Output::SkipToColumn(0x28);
  PrintTypeStack(this);
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintOpBegin(WasmOp op)
{
    if (lastOpId == opId) Output::Print(_u("\r\n"));
    lastOpId = ++opId;
    const int depth = m_blockInfos.Count() - 1;
    if (depth > 0)
    {
        Output::SkipToColumn(depth);
    }
    const auto PrintSignature = [this](uint32 sigId)
    {
        if (sigId < m_module->GetSignatureCount())
        {
            Output::Print(_u(" "));
            WasmSignature* sig = m_module->GetSignature(sigId);
            sig->Dump(64);
        }
        else
        {
            Output::Print(_u(" invalid signature id %u"), sigId);
        }
    };

    switch (op)
    {
#define WASM_OPCODE(opname, ...) \
case wb##opname: \
    Output::Print(_u(#opname)); \
    break;
#include "WasmBinaryOpCodes.h"
    }
    switch (op)
    {
    case wbIf:
    case wbLoop:
    case wbBlock: 
        if (GetReader()->m_currentNode.block.IsSingleResult())
        {
            Output::Print(_u(" () -> %s"), GetTypeName(GetReader()->m_currentNode.block.GetSingleResult()));
        }
        else
        {
            PrintSignature(GetReader()->m_currentNode.block.GetSignatureId()); break;
        }
        break;
    case wbBr:
    case wbBrIf: Output::Print(_u(" depth: %u"), GetReader()->m_currentNode.br.depth); break;
    case wbBrTable: Output::Print(_u(" %u cases, default: %u"), GetReader()->m_currentNode.brTable.numTargets, GetReader()->m_currentNode.brTable.defaultTarget); break;
    case wbCallIndirect: PrintSignature(GetReader()->m_currentNode.call.num); break;
    case wbCall:
    {
        uint32 id = GetReader()->m_currentNode.call.num;
        if (id < m_module->GetWasmFunctionCount())
        {
            FunctionIndexTypes::Type funcType = GetReader()->m_currentNode.call.funcType;
            switch (funcType)
            {
            case Wasm::FunctionIndexTypes::Invalid: Output::Print(_u(" (invalid) ")); break;
            case Wasm::FunctionIndexTypes::ImportThunk: Output::Print(_u(" (thunk) ")); break;
            case Wasm::FunctionIndexTypes::Function: Output::Print(_u(" (func) ")); break;
            case Wasm::FunctionIndexTypes::Import: Output::Print(_u(" (import) ")); break;
            default:  Output::Print(_u(" (unknown)")); break;
            }
            auto func = this->m_module->GetWasmFunctionInfo(id);
            func->GetBody()->DumpFullFunctionName();
        }
        else
        {
            Output::Print(_u(" invalid id %u"), id);
        }
        break;
    }
    case wbSetLocal:
    case wbGetLocal:
    case wbTeeLocal:
    case wbGetGlobal:
    case wbSetGlobal: Output::Print(_u(" (%d)"), GetReader()->m_currentNode.var.num); break;
    case wbI32Const: Output::Print(_u(" (%d, 0x%x)"), GetReader()->m_currentNode.cnst.i32, GetReader()->m_currentNode.cnst.i32); break;
    case wbI64Const: Output::Print(_u(" (%lld, 0x%llx)"), GetReader()->m_currentNode.cnst.i64, GetReader()->m_currentNode.cnst.i64); break;
    case wbF32Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f32); break;
    case wbF64Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f64); break;
#define WASM_MEM_OPCODE(opname, ...) case wb##opname: // FallThrough
#include "WasmBinaryOpCodes.h"
    {
        const uint8 alignment = GetReader()->m_currentNode.mem.alignment;
        const uint32 offset = GetReader()->m_currentNode.mem.offset;
        switch (((!!alignment) << 1) | (!!offset))
        {
        case 0: // no alignment, no offset
            Output::Print(_u(" [i]")); break;
        case 1: // no alignment, offset
            Output::Print(_u(" [i + %u (0x%x)]"), offset, offset); break;
        case 2: // alignment, no offset
            Output::Print(_u(" [i & ~0x%x]"), (1 << alignment) - 1); break;
        case 3: // alignment, offset
            Output::Print(_u(" [i + %u (0x%x) & ~0x%x]"), offset, offset, (1 << alignment) - 1); break;
        }
        break;
    }
    }
    Output::SkipToColumn(40);
    PrintTypeStack();
}